

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

bool __thiscall
Diligent::RefCntWeakPtr<Diligent::IRenderDevice>::IsValid
          (RefCntWeakPtr<Diligent::IRenderDevice> *this)

{
  ReferenceCounterValueType RVar1;
  bool local_11;
  RefCntWeakPtr<Diligent::IRenderDevice> *this_local;
  
  local_11 = false;
  if ((this->m_pObject != (IRenderDevice *)0x0) &&
     (local_11 = false, this->m_pRefCounters != (RefCountersImpl *)0x0)) {
    RVar1 = RefCountersImpl::GetNumStrongRefs(this->m_pRefCounters);
    local_11 = 0 < RVar1;
  }
  return local_11;
}

Assistant:

bool IsValid() const noexcept
    {
        return m_pObject != nullptr && m_pRefCounters != nullptr && m_pRefCounters->GetNumStrongRefs() > 0;
    }